

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O3

int rtr_sync_update_tables
              (rtr_socket *rtr_socket,pfx_table *pfx_table,spki_table *spki_table,
              aspa_table *aspa_table,pdu_ipv4 *ipv4_pdus,uint ipv4_pdu_count,pdu_ipv6 *ipv6_pdus,
              uint ipv6_pdu_count,pdu_router_key *router_key_pdus,uint router_key_pdu_count,
              pdu_aspa **aspa_pdus,size_t aspa_pdu_count,pdu_end_of_data_v0 *eod_pdu)

{
  ushort uVar1;
  pdu_aspa *ppVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  aspa_status aVar6;
  int iVar7;
  aspa_update_operation *operations;
  pdu_error_type pVar8;
  _Bool *p_Var9;
  pdu_router_key *erroneous_pdu;
  aspa_operation_type aVar10;
  pdu_aspa *ppVar11;
  size_t sVar12;
  ulong ipv4_pdu_count_00;
  ulong uVar13;
  size_t sVar14;
  pdu_ipv4 *pdu;
  pdu_ipv6 *pdu_00;
  long in_FS_OFFSET;
  char txt [49];
  spki_record entry;
  aspa_update *local_100;
  char local_f8 [16];
  ulong local_e8;
  char acStack_e0 [40];
  spki_record local_b8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_100 = (aspa_update *)0x0;
  ipv4_pdu_count_00 = (ulong)ipv4_pdu_count;
  if (ipv4_pdu_count != 0) {
    uVar13 = 0;
    pdu = ipv4_pdus;
    do {
      iVar5 = rtr_update_pfx_table(rtr_socket,pfx_table,pdu);
      if (iVar5 == -1) {
        lrtr_dbg("RTR Socket: error while updating v4 prefixes");
        sVar14 = 0;
        goto LAB_0010b160;
      }
      uVar13 = uVar13 + 1;
      pdu = pdu + 1;
    } while (ipv4_pdu_count_00 != uVar13);
  }
  lrtr_dbg("RTR Socket: v4 prefixes added");
  if (ipv6_pdu_count != 0) {
    sVar14 = 0;
    pdu_00 = ipv6_pdus;
LAB_0010af75:
    iVar5 = rtr_update_pfx_table(rtr_socket,pfx_table,pdu_00);
    if (iVar5 != -1) goto code_r0x0010af8c;
    lrtr_dbg("RTR Socket: error while updating v6 prefixes");
    uVar13 = ipv4_pdu_count_00;
LAB_0010b160:
    iVar5 = rtr_undo_update_pfx_table_batch(rtr_socket,pfx_table,ipv4_pdus,uVar13,ipv6_pdus,sVar14);
    aspa_table_update_swap_in_discard(&local_100);
    goto LAB_0010b4b9;
  }
LAB_0010af9a:
  lrtr_dbg("RTR Socket: v6 prefixes added");
  if (router_key_pdu_count != 0) {
    if (rtr_socket == (rtr_socket *)0x0) {
      __assert_fail("rtr_socket",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/rtr/packets.c"
                    ,0x3ea,
                    "int rtr_update_spki_table(struct rtr_socket *, struct spki_table *, const void *)"
                   );
    }
    if (router_key_pdus == (pdu_router_key *)0x0) {
      __assert_fail("pdu",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/rtr/packets.c"
                    ,0x3eb,
                    "int rtr_update_spki_table(struct rtr_socket *, struct spki_table *, const void *)"
                   );
    }
    uVar13 = 0;
    erroneous_pdu = router_key_pdus;
    do {
      if (spki_table != (spki_table *)0x0) {
        if (erroneous_pdu->type != '\t') {
          __assert_fail("type == ROUTER_KEY",
                        "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/rtr/packets.c"
                        ,0x3f6,
                        "int rtr_update_spki_table(struct rtr_socket *, struct spki_table *, const void *)"
                       );
        }
        local_b8.asn = erroneous_pdu->asn;
        uVar3 = *(undefined8 *)erroneous_pdu->ski;
        uVar4 = *(undefined8 *)(erroneous_pdu->ski + 8);
        local_b8.ski._0_4_ = SUB84(uVar3,0);
        local_b8.ski._4_2_ = SUB82((ulong)uVar3 >> 0x20,0);
        local_b8.ski._6_2_ = SUB82((ulong)uVar3 >> 0x30,0);
        local_b8.ski._8_4_ = SUB84(uVar4,0);
        local_b8.ski._12_2_ = SUB82((ulong)uVar4 >> 0x20,0);
        local_b8.ski[0xe] = (uint8_t)((ulong)uVar4 >> 0x30);
        local_b8.ski[0xf] = (uint8_t)((ulong)uVar4 >> 0x38);
        local_b8.ski._16_4_ = *(undefined4 *)(erroneous_pdu->ski + 0x10);
        memcpy(local_b8.spki,erroneous_pdu->spki,0x5b);
        local_b8.socket = rtr_socket;
        if (erroneous_pdu->flags == '\0') {
          iVar5 = spki_table_remove_entry(spki_table,&local_b8);
LAB_0010b091:
          if (iVar5 == -3) {
            lrtr_dbg("RTR Socket: Withdrawal of unknown router key");
            pVar8 = WITHDRAWAL_OF_UNKNOWN_RECORD;
LAB_0010b2cf:
            rtr_send_error_pdu_from_host(rtr_socket,erroneous_pdu,0x7b,pVar8,(char *)0x0,0);
          }
          else {
            if (iVar5 != -1) {
              if (iVar5 != -2) goto LAB_0010b0ac;
              lrtr_dbg("RTR Socket: Duplicate Announcement for router key: ASN: %u received",
                       (ulong)local_b8.asn);
              pVar8 = DUPLICATE_ANNOUNCEMENT;
              goto LAB_0010b2cf;
            }
            builtin_strncpy(local_f8,"spki_table Error",0x10);
            local_e8 = local_e8 & 0xffffffffffffff00;
            lrtr_dbg("RTR Socket: %s");
          }
          rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
        }
        else {
          if (erroneous_pdu->flags == '\x01') {
            iVar5 = spki_table_add_entry(spki_table,&local_b8);
            goto LAB_0010b091;
          }
          builtin_strncpy(acStack_e0 + 8,"s value received",0x11);
          local_e8._0_1_ = 'i';
          local_e8._1_1_ = 't';
          local_e8._2_1_ = 'h';
          local_e8._3_1_ = ' ';
          local_e8._4_1_ = 'i';
          local_e8._5_1_ = 'n';
          local_e8._6_1_ = 'v';
          local_e8._7_1_ = 'a';
          builtin_strncpy(acStack_e0,"lid flag",8);
          builtin_strncpy(local_f8,"Router Key PDU w",0x10);
          lrtr_dbg("RTR Socket: %s",local_f8);
          rtr_send_error_pdu_from_host(rtr_socket,erroneous_pdu,0x7b,CORRUPT_DATA,local_f8,0x31);
        }
        lrtr_dbg("RTR Socket: error while updating spki data");
        goto LAB_0010b47f;
      }
      builtin_memcpy(local_b8.ski,"IGNORING INCOMING SP",0x14);
      local_b8.asn = 0x4f20494b;
      builtin_memcpy(local_b8.spki,"BJECTS",7);
      lrtr_dbg("RTR Socket: %s",&local_b8);
LAB_0010b0ac:
      uVar13 = uVar13 + 1;
      erroneous_pdu = erroneous_pdu + 1;
    } while (router_key_pdu_count != uVar13);
  }
  lrtr_dbg("RTR Socket: spki data added");
  if (rtr_socket == (rtr_socket *)0x0) {
    __assert_fail("rtr_socket",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/rtr/packets.c"
                  ,0x42a,
                  "int rtr_compute_update_aspa_table(struct rtr_socket *, struct aspa_table *, struct pdu_aspa **, size_t, struct aspa_update **)"
                 );
  }
  if (aspa_table == (aspa_table *)0x0) {
    __assert_fail("aspa_table",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/rtr/packets.c"
                  ,0x42b,
                  "int rtr_compute_update_aspa_table(struct rtr_socket *, struct aspa_table *, struct pdu_aspa **, size_t, struct aspa_update **)"
                 );
  }
  if (aspa_pdus == (pdu_aspa **)0x0 || aspa_pdu_count == 0) {
    if (aspa_pdu_count == 0 || aspa_pdus != (pdu_aspa **)0x0) {
LAB_0010b3cf:
      aspa_table_update_swap_in_apply(&local_100);
      iVar5 = 0;
      lrtr_dbg("RTR Socket: ASPA data added");
      rtr_socket->serial_number = eod_pdu->sn;
      lrtr_dbg("RTR Socket: Sync successful, received %u Prefix PDUs, %u Router Key PDUs, %lu ASPA PDUs, session_id: %u, SN: %u"
               ,(ulong)(ipv6_pdu_count + ipv4_pdu_count),(ulong)router_key_pdu_count,aspa_pdu_count,
               (ulong)rtr_socket->session_id);
      goto LAB_0010b4d4;
    }
  }
  else {
    operations = (aspa_update_operation *)lrtr_malloc(aspa_pdu_count * 0x30);
    if (operations == (aspa_update_operation *)0x0) {
      builtin_memcpy(local_b8.ski + 8,"ailed",6);
      builtin_memcpy(local_b8.ski,"Malloc f",8);
LAB_0010b350:
      lrtr_dbg("RTR Socket: %s");
    }
    else {
      p_Var9 = &operations->is_no_op;
      sVar14 = 0;
      do {
        ppVar2 = aspa_pdus[sVar14];
        aVar10 = ppVar2->flags & ASPA_ADD;
        p_Var9[-0x20] = (_Bool)aVar10;
        *p_Var9 = false;
        ((aspa_record *)(p_Var9 + -0x18))->customer_asn = ppVar2->customer_asn;
        if (aVar10 == ASPA_REMOVE) {
          sVar12 = 0;
        }
        else {
          sVar12 = (size_t)ppVar2->provider_count;
        }
        *(size_t *)(p_Var9 + -0x10) = sVar12;
        ppVar11 = (pdu_aspa *)0x0;
        if (aVar10 != ASPA_REMOVE) {
          ppVar11 = ppVar2 + 1;
        }
        *(pdu_aspa **)(p_Var9 + -8) = ppVar11;
        ((aspa_update_operation *)(p_Var9 + -0x28))->index = sVar14;
        sVar14 = sVar14 + 1;
        p_Var9 = p_Var9 + 0x30;
      } while (aspa_pdu_count != sVar14);
      aVar6 = aspa_table_update_swap_in_compute
                        (aspa_table,rtr_socket,operations,aspa_pdu_count,&local_100);
      if ((local_100 == (aspa_update *)0x0) ||
         (local_100->failed_operation == (aspa_update_operation *)0x0)) {
        if (aVar6 == ASPA_SUCCESS) {
LAB_0010b3c1:
          lrtr_dbg("RTR Socket: ASPA update computed");
          goto LAB_0010b3cf;
        }
        builtin_memcpy(local_b8.ski,"aspa_table Error",0x10);
        local_b8.ski._16_4_ = local_b8.ski._16_4_ & 0xffffff00;
        goto LAB_0010b350;
      }
      ppVar2 = aspa_pdus[local_100->failed_operation->index];
      uVar1 = ppVar2->provider_count;
      if (aVar6 == ASPA_RECORD_NOT_FOUND) {
        lrtr_dbg("RTR Socket: Withdrawal of unknown ASPA customer ASN: %u",
                 (ulong)ppVar2->customer_asn);
        pVar8 = WITHDRAWAL_OF_UNKNOWN_RECORD;
      }
      else {
        if (aVar6 != ASPA_DUPLICATE_RECORD) goto LAB_0010b3c1;
        lrtr_dbg("RTR Socket: Duplicate Announcement for ASPA customer ASN: %u received",
                 (ulong)ppVar2->customer_asn);
        pVar8 = DUPLICATE_ANNOUNCEMENT;
      }
      rtr_send_error_pdu_from_host(rtr_socket,ppVar2,(uint)uVar1 * 4 + 0x10,pVar8,(char *)0x0,0);
    }
    rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
  }
  lrtr_dbg("RTR Socket: error while computing ASPA update");
  uVar13 = (ulong)router_key_pdu_count;
LAB_0010b47f:
  iVar5 = rtr_undo_update_spki_table_batch(rtr_socket,spki_table,router_key_pdus,uVar13);
  iVar7 = rtr_undo_update_pfx_table_batch
                    (rtr_socket,pfx_table,ipv4_pdus,ipv4_pdu_count_00,ipv6_pdus,
                     (ulong)ipv6_pdu_count);
  aspa_table_update_swap_in_discard(&local_100);
  if (iVar7 == -1) {
LAB_0010b4be:
    rtr_socket->request_session_id = true;
  }
  else {
LAB_0010b4b9:
    if (iVar5 == -1) goto LAB_0010b4be;
  }
  rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
  iVar5 = -1;
LAB_0010b4d4:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar5;
code_r0x0010af8c:
  sVar14 = sVar14 + 1;
  pdu_00 = pdu_00 + 1;
  if (ipv6_pdu_count == sVar14) goto LAB_0010af9a;
  goto LAB_0010af75;
}

Assistant:

static int rtr_sync_update_tables(struct rtr_socket *rtr_socket, struct pfx_table *pfx_table,
				  struct spki_table *spki_table, struct aspa_table *aspa_table,
				  struct pdu_ipv4 *ipv4_pdus, const unsigned int ipv4_pdu_count,
				  struct pdu_ipv6 *ipv6_pdus, const unsigned int ipv6_pdu_count,
				  struct pdu_router_key *router_key_pdus, const unsigned int router_key_pdu_count,
				  struct pdu_aspa **aspa_pdus, const size_t aspa_pdu_count,
				  struct pdu_end_of_data_v0 *eod_pdu)
{
	bool proceed = true;
	bool undo_failed = false;
#if ASPA_UPDATE_MECHANISM == ASPA_SWAP_IN
	struct aspa_update *aspa_update = NULL;
#elif ASPA_UPDATE_MECHANISM == ASPA_IN_PLACE
	struct aspa_update_operation *aspa_failed_operation = NULL;
	struct aspa_update_operation *aspa_operations = NULL;
#else
#error "Invalid ASPA_UPDATE_MECHANISM value."
#endif /* ASPA_UPDATE_MECHANISM */

	// add all IPv4 prefix pdu to the pfx_table
	for (size_t i = 0; i < ipv4_pdu_count; i++) {
		if (rtr_update_pfx_table(rtr_socket, pfx_table, &(ipv4_pdus[i])) == RTR_ERROR) {
			RTR_DBG1("error while updating v4 prefixes");
			proceed = false;

			if (rtr_undo_update_pfx_table_batch(rtr_socket, pfx_table, ipv4_pdus, i, ipv6_pdus, 0) ==
			    RTR_ERROR)
				undo_failed = true;

			break;
		}
	}

	if (proceed) {
		RTR_DBG1("v4 prefixes added");

		// add all IPv6 prefix pdu to the pfx_table
		for (size_t i = 0; i < ipv6_pdu_count; i++) {
			if (rtr_update_pfx_table(rtr_socket, pfx_table, &(ipv6_pdus[i])) == RTR_ERROR) {
				RTR_DBG1("error while updating v6 prefixes");
				proceed = false;

				if (rtr_undo_update_pfx_table_batch(rtr_socket, pfx_table, ipv4_pdus, ipv4_pdu_count,
								    ipv6_pdus, i) == RTR_ERROR)
					undo_failed = true;

				break;
			}
		}
	}

	if (proceed) {
		RTR_DBG1("v6 prefixes added");

		// add all router key pdu to the spki_table
		for (size_t i = 0; i < router_key_pdu_count; i++) {
			if (rtr_update_spki_table(rtr_socket, spki_table, &(router_key_pdus[i])) == RTR_ERROR) {
				RTR_DBG1("error while updating spki data");
				proceed = false;

				if (rtr_undo_update_spki_table_batch(rtr_socket, spki_table, router_key_pdus, i) ==
				    RTR_ERROR)
					undo_failed = true;

				if (rtr_undo_update_pfx_table_batch(rtr_socket, pfx_table, ipv4_pdus, ipv4_pdu_count,
								    ipv6_pdus, ipv6_pdu_count) == RTR_ERROR)
					undo_failed = true;

				break;
			}
		}
	}

#if ASPA_UPDATE_MECHANISM == ASPA_SWAP_IN
	if (proceed) {
		RTR_DBG1("spki data added");

		if (rtr_compute_update_aspa_table(rtr_socket, aspa_table, aspa_pdus, aspa_pdu_count, &aspa_update) ==
		    RTR_ERROR) {
			RTR_DBG1("error while computing ASPA update");
			proceed = false;

			if (rtr_undo_update_spki_table_batch(rtr_socket, spki_table, router_key_pdus,
							     router_key_pdu_count) == RTR_ERROR)
				undo_failed = true;

			if (rtr_undo_update_pfx_table_batch(rtr_socket, pfx_table, ipv4_pdus, ipv4_pdu_count, ipv6_pdus,
							    ipv6_pdu_count) == RTR_ERROR)
				undo_failed = true;
		}
	}

	if (proceed) {
		aspa_table_update_swap_in_apply(&aspa_update);
		RTR_DBG1("ASPA data added");
	} else {
		aspa_table_update_swap_in_discard(&aspa_update);
	}

#elif ASPA_UPDATE_MECHANISM == ASPA_IN_PLACE
	if (proceed) {
		RTR_DBG1("spki data added");

		if (rtr_update_aspa_table(rtr_socket, aspa_table, aspa_pdus, aspa_pdu_count, &aspa_operations,
					  &aspa_failed_operation) == RTR_ERROR) {
			RTR_DBG1("error while updating ASPA data");
			proceed = false;

			if (rtr_undo_update_aspa_table(rtr_socket, aspa_table, aspa_operations, aspa_pdu_count,
						       aspa_failed_operation) == RTR_ERROR)
				undo_failed = true;

			if (rtr_undo_update_spki_table_batch(rtr_socket, spki_table, router_key_pdus,
							     router_key_pdu_count) == RTR_ERROR)
				undo_failed = true;

			if (rtr_undo_update_pfx_table_batch(rtr_socket, pfx_table, ipv4_pdus, ipv4_pdu_count, ipv6_pdus,
							    ipv6_pdu_count) == RTR_ERROR)
				undo_failed = true;
		}
	}

	if (proceed)
		RTR_DBG1("ASPA data added");

	aspa_table_update_in_place_cleanup(&aspa_operations, aspa_pdu_count);
	aspa_failed_operation = NULL;
#else
#error "Invalid ASPA_UPDATE_MECHANISM value."
#endif /* ASPA_UPDATE_MECHANISM */

	// An update attempted above failed
	if (!proceed) {
		if (undo_failed)
			// undo failed, so request new session
			rtr_socket->request_session_id = true;

		rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
		return RTR_ERROR;
	}

	rtr_socket->serial_number = eod_pdu->sn;
	RTR_DBG("Sync successful, received %u Prefix PDUs, %u Router Key PDUs, %lu ASPA PDUs, session_id: %u, SN: %u",
		(ipv4_pdu_count + ipv6_pdu_count), router_key_pdu_count, aspa_pdu_count, rtr_socket->session_id,
		rtr_socket->serial_number);

	return RTR_SUCCESS;
}